

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directory(path *p,error_code *ec)

{
  bool bVar1;
  error_code *in_stack_000000a8;
  path *in_stack_000000b0;
  path *in_stack_000000b8;
  
  path::path((path *)0x28e242);
  bVar1 = create_directory(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  path::~path((path *)0x28e264);
  return bVar1;
}

Assistant:

GHC_INLINE bool create_directory(const path& p, std::error_code& ec) noexcept
{
    return create_directory(p, path(), ec);
}